

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_save.c
# Opt level: O0

int write_file(smf_t *smf,char *file_name)

{
  int iVar1;
  FILE *__s;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  FILE *stream;
  char *file_name_local;
  smf_t *smf_local;
  
  __s = fopen(file_name,"wb+");
  if (__s == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    g_log("libsmf",8,"Cannot open input file: %s",pcVar3);
    smf_local._4_4_ = -1;
  }
  else {
    sVar4 = fwrite(smf->file_buffer,1,(long)smf->file_buffer_length,__s);
    if (sVar4 == (long)smf->file_buffer_length) {
      iVar1 = fclose(__s);
      if (iVar1 == 0) {
        smf_local._4_4_ = 0;
      }
      else {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        g_log("libsmf",8,"fclose(3) failed: %s",pcVar3);
        smf_local._4_4_ = -3;
      }
    }
    else {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      g_log("libsmf",8,"fwrite(3) failed: %s",pcVar3);
      smf_local._4_4_ = -2;
    }
  }
  return smf_local._4_4_;
}

Assistant:

static int
write_file(smf_t *smf, const char *file_name)
{
	FILE *stream;

	stream = fopen(file_name, "wb+");
	if (stream == NULL) {
		g_critical("Cannot open input file: %s", strerror(errno));

		return (-1);
	}

	if (fwrite(smf->file_buffer, 1, smf->file_buffer_length, stream) != smf->file_buffer_length) {
		g_critical("fwrite(3) failed: %s", strerror(errno));

		return (-2);
	}

	if (fclose(stream)) {
		g_critical("fclose(3) failed: %s", strerror(errno));

		return (-3);
	}

	return (0);
}